

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

HTS_Boolean HTS_Engine_load(HTS_Engine *engine,char **voices,size_t num_voices)

{
  HTS_Boolean HVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  char *__haystack;
  char *pcVar6;
  ulong in_RDX;
  size_t *in_RDI;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  char *find;
  char *option;
  double average_weight;
  size_t nstream;
  size_t j;
  size_t i;
  size_t in_stack_000008f8;
  char **in_stack_00000900;
  HTS_ModelSet *in_stack_00000908;
  size_t in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  HTS_Engine *in_stack_ffffffffffffffc0;
  ulong local_30;
  ulong local_28;
  HTS_Boolean local_1;
  
  HTS_Engine_clear(in_stack_ffffffffffffffc0);
  HVar1 = HTS_ModelSet_load(in_stack_00000908,in_stack_00000900,in_stack_000008f8);
  if (HVar1 == '\x01') {
    sVar3 = HTS_ModelSet_get_nstream((HTS_ModelSet *)(in_RDI + 0x16));
    auVar9._8_4_ = (int)(in_RDX >> 0x20);
    auVar9._0_8_ = in_RDX;
    auVar9._12_4_ = 0x45300000;
    dVar7 = 1.0 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0));
    sVar4 = HTS_ModelSet_get_sampling_frequency((HTS_ModelSet *)(in_RDI + 0x16));
    *in_RDI = sVar4;
    sVar4 = HTS_ModelSet_get_fperiod((HTS_ModelSet *)(in_RDI + 0x16));
    in_RDI[1] = sVar4;
    pvVar5 = HTS_calloc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_RDI[5] = (size_t)pvVar5;
    for (local_28 = 0; local_28 < sVar3; local_28 = local_28 + 1) {
      *(undefined8 *)(in_RDI[5] + local_28 * 8) = 0x3fe0000000000000;
    }
    pvVar5 = HTS_calloc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_RDI[6] = (size_t)pvVar5;
    for (local_28 = 0; local_28 < sVar3; local_28 = local_28 + 1) {
      *(undefined8 *)(in_RDI[6] + local_28 * 8) = 0x3ff0000000000000;
    }
    __haystack = HTS_ModelSet_get_option((HTS_ModelSet *)(in_RDI + 0x16),0);
    pcVar6 = strstr(__haystack,"GAMMA=");
    if (pcVar6 != (char *)0x0) {
      iVar2 = atoi(pcVar6 + 6);
      in_RDI[9] = (long)iVar2;
    }
    pcVar6 = strstr(__haystack,"LN_GAIN=");
    if (pcVar6 != (char *)0x0) {
      iVar2 = atoi(pcVar6 + 8);
      *(bool *)(in_RDI + 10) = iVar2 == 1;
    }
    pcVar6 = strstr(__haystack,"ALPHA=");
    if (pcVar6 != (char *)0x0) {
      dVar8 = atof(pcVar6 + 6);
      in_RDI[0xb] = (size_t)dVar8;
    }
    pvVar5 = HTS_calloc((size_t)__haystack,(size_t)pcVar6);
    in_RDI[0xe] = (size_t)pvVar5;
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      *(double *)(in_RDI[0xe] + local_28 * 8) = dVar7;
    }
    pvVar5 = HTS_calloc((size_t)__haystack,(size_t)pcVar6);
    in_RDI[0xf] = (size_t)pvVar5;
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      pvVar5 = HTS_calloc((size_t)__haystack,(size_t)pcVar6);
      *(void **)(in_RDI[0xf] + local_28 * 8) = pvVar5;
      for (local_30 = 0; local_30 < sVar3; local_30 = local_30 + 1) {
        *(double *)(*(long *)(in_RDI[0xf] + local_28 * 8) + local_30 * 8) = dVar7;
      }
    }
    pvVar5 = HTS_calloc((size_t)__haystack,(size_t)pcVar6);
    in_RDI[0x10] = (size_t)pvVar5;
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
      pvVar5 = HTS_calloc((size_t)__haystack,(size_t)pcVar6);
      *(void **)(in_RDI[0x10] + local_28 * 8) = pvVar5;
      for (local_30 = 0; local_30 < sVar3; local_30 = local_30 + 1) {
        *(double *)(*(long *)(in_RDI[0x10] + local_28 * 8) + local_30 * 8) = dVar7;
      }
    }
    local_1 = '\x01';
  }
  else {
    HTS_Engine_clear(in_stack_ffffffffffffffc0);
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

HTS_Boolean HTS_Engine_load(HTS_Engine * engine, char **voices, size_t num_voices)
{
   size_t i, j;
   size_t nstream;
   double average_weight;
   const char *option, *find;

   /* reset engine */
   HTS_Engine_clear(engine);

   /* load voices */
   if (HTS_ModelSet_load(&engine->ms, voices, num_voices) != TRUE) {
      HTS_Engine_clear(engine);
      return FALSE;
   }
   nstream = HTS_ModelSet_get_nstream(&engine->ms);
   average_weight = 1.0 / num_voices;

   /* global */
   engine->condition.sampling_frequency = HTS_ModelSet_get_sampling_frequency(&engine->ms);
   engine->condition.fperiod = HTS_ModelSet_get_fperiod(&engine->ms);
   engine->condition.msd_threshold = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.msd_threshold[i] = 0.5;
   engine->condition.gv_weight = (double *) HTS_calloc(nstream, sizeof(double));
   for (i = 0; i < nstream; i++)
      engine->condition.gv_weight[i] = 1.0;

   /* spectrum */
   option = HTS_ModelSet_get_option(&engine->ms, 0);
   find = strstr(option, "GAMMA=");
   if (find != NULL)
      engine->condition.stage = (size_t) atoi(&find[strlen("GAMMA=")]);
   find = strstr(option, "LN_GAIN=");
   if (find != NULL)
      engine->condition.use_log_gain = atoi(&find[strlen("LN_GAIN=")]) == 1 ? TRUE : FALSE;
   find = strstr(option, "ALPHA=");
   if (find != NULL)
      engine->condition.alpha = atof(&find[strlen("ALPHA=")]);

   /* interpolation weights */
   engine->condition.duration_iw = (double *) HTS_calloc(num_voices, sizeof(double));
   for (i = 0; i < num_voices; i++)
      engine->condition.duration_iw[i] = average_weight;
   engine->condition.parameter_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.parameter_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.parameter_iw[i][j] = average_weight;
   }
   engine->condition.gv_iw = (double **) HTS_calloc(num_voices, sizeof(double *));
   for (i = 0; i < num_voices; i++) {
      engine->condition.gv_iw[i] = (double *) HTS_calloc(nstream, sizeof(double));
      for (j = 0; j < nstream; j++)
         engine->condition.gv_iw[i][j] = average_weight;
   }

   return TRUE;
}